

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O3

void __thiscall
t_json_generator::write_const_value
          (t_json_generator *this,t_const_value *value,bool should_force_string)

{
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  t_const_value_type tVar4;
  int64_t iVar5;
  _Base_ptr p_Var6;
  _Alloc_hider _Var7;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  map;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> list;
  _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  local_80;
  string local_50;
  
  tVar4 = t_const_value::get_type(value);
  switch(tVar4) {
  case CV_INTEGER:
  case CV_IDENTIFIER:
    if (!should_force_string) {
      iVar5 = t_const_value::get_integer(value);
      write_number<long>(this,iVar5);
      return;
    }
    iVar5 = t_const_value::get_integer(value);
    number_to_string<long>((string *)&local_80,this,iVar5);
    write_string(this,(string *)&local_80);
    break;
  case CV_DOUBLE:
    if (!should_force_string) {
      write_number<double>(this,value->doubleVal_);
      return;
    }
    number_to_string<double>((string *)&local_80,this,value->doubleVal_);
    write_string(this,(string *)&local_80);
    break;
  case CV_STRING:
    pp_Var1 = &local_80._M_impl.super__Rb_tree_header._M_header._M_parent;
    pcVar3 = (value->stringVal_)._M_dataplus._M_p;
    local_80._M_impl._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar3,pcVar3 + (value->stringVal_)._M_string_length);
    write_string(this,(string *)&local_80);
    _Var7._M_p = (pointer)local_80._M_impl._0_8_;
    if ((_Base_ptr *)local_80._M_impl._0_8_ == pp_Var1) {
      return;
    }
    goto LAB_002a7898;
  case CV_MAP:
    start_object(this,false);
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::_Rb_tree(&local_80,
               (_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                *)value);
    p_Var2 = &local_80._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_80._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
      p_Var6 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        write_comma_if_needed(this);
        t_generator::indent_abi_cxx11_(&local_50,&this->super_t_generator);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&this->f_json_,local_50._M_dataplus._M_p,local_50._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        write_const_value(this,*(t_const_value **)(p_Var6 + 1),true);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->f_json_,": ",2);
        write_const_value(this,(t_const_value *)p_Var6[1]._M_parent,false);
        indicate_comma_needed(this);
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var2);
    }
    end_object(this);
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::~_Rb_tree(&local_80);
    return;
  case CV_LIST:
    start_array(this);
    std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::vector
              ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)&local_50,
               &value->listVal_);
    if (local_50._M_dataplus._M_p != (pointer)local_50._M_string_length) {
      _Var7._M_p = local_50._M_dataplus._M_p;
      do {
        write_comma_if_needed(this);
        t_generator::indent_abi_cxx11_((string *)&local_80,&this->super_t_generator);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&this->f_json_,(char *)local_80._M_impl._0_8_,
                   local_80._M_impl.super__Rb_tree_header._M_header._0_8_);
        if ((_Base_ptr *)local_80._M_impl._0_8_ !=
            &local_80._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_80._M_impl._0_8_);
        }
        write_const_value(this,*(t_const_value **)_Var7._M_p,false);
        indicate_comma_needed(this);
        _Var7._M_p = _Var7._M_p + 8;
      } while (_Var7._M_p != (pointer)local_50._M_string_length);
    }
    end_array(this);
    _Var7._M_p = local_50._M_dataplus._M_p;
    if ((_Base_ptr *)local_50._M_dataplus._M_p == (_Base_ptr *)0x0) {
      return;
    }
    goto LAB_002a7898;
  default:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->f_json_,"null",4);
    return;
  }
  _Var7._M_p = (pointer)local_80._M_impl._0_8_;
  if ((_Base_ptr *)local_80._M_impl._0_8_ ==
      &local_80._M_impl.super__Rb_tree_header._M_header._M_parent) {
    return;
  }
LAB_002a7898:
  operator_delete(_Var7._M_p);
  return;
}

Assistant:

void t_json_generator::write_const_value(t_const_value* value, bool should_force_string) {

  switch (value->get_type()) {

  case t_const_value::CV_IDENTIFIER:
  case t_const_value::CV_INTEGER:
    if (should_force_string) {
      write_string(number_to_string(value->get_integer()));
    } else {
      write_number(value->get_integer());
    }
    break;

  case t_const_value::CV_DOUBLE:
    if (should_force_string) {
      write_string(number_to_string(value->get_double()));
    } else {
      write_number(value->get_double());
    }
    break;

  case t_const_value::CV_STRING:
    write_string(value->get_string());
    break;

  case t_const_value::CV_LIST: {
    start_array();
    std::vector<t_const_value*> list = value->get_list();
    std::vector<t_const_value*>::iterator lit;
    for (lit = list.begin(); lit != list.end(); ++lit) {
      write_comma_if_needed();
      f_json_ << indent();
      write_const_value(*lit);
      indicate_comma_needed();
    }
    end_array();
    break;
  }

  case t_const_value::CV_MAP: {
    start_object(NO_INDENT);
    std::map<t_const_value*, t_const_value*, t_const_value::value_compare> map = value->get_map();
    std::map<t_const_value*, t_const_value*, t_const_value::value_compare>::iterator mit;
    for (mit = map.begin(); mit != map.end(); ++mit) {
      write_comma_if_needed();
      f_json_ << indent();
      // JSON objects only allow string keys
      write_const_value(mit->first, FORCE_STRING);
      f_json_ << ": ";
      write_const_value(mit->second);
      indicate_comma_needed();
    }
    end_object();
    break;
  }

  default:
    f_json_ << "null";
    break;
  }
}